

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uvectr32.h
# Opt level: O1

void __thiscall icu_63::UVector32::addElement(UVector32 *this,int32_t elem,UErrorCode *status)

{
  int iVar1;
  UBool UVar2;
  
  iVar1 = this->count;
  if (((iVar1 < -1) || (this->capacity <= iVar1)) &&
     (UVar2 = expandCapacity(this,iVar1 + 1,status), UVar2 == '\0')) {
    return;
  }
  this->elements[this->count] = elem;
  this->count = this->count + 1;
  return;
}

Assistant:

inline void UVector32::addElement(int32_t elem, UErrorCode &status) {
    if (ensureCapacity(count + 1, status)) {
        elements[count] = elem;
        count++;
    }
}